

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O2

void __thiscall xLearn::DMatrix::~DMatrix(DMatrix *this)

{
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->norm).super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->Y).super__Vector_base<float,_std::allocator<float>_>);
  std::
  _Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ::~_Vector_base(&(this->row).
                   super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                 );
  return;
}

Assistant:

~DMatrix() { }